

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_drop(parser *p)

{
  wchar_t tval_00;
  wchar_t sval_00;
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  object_kind *poVar4;
  undefined8 *puVar5;
  wchar_t sval;
  wchar_t tval;
  object_kind *k;
  monster_drop *d;
  monster_race *r;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getsym(p,"tval");
    tval_00 = tval_find_idx(pcVar3);
    if (tval_00 < L'\0') {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      pcVar3 = parser_getsym(p,"sval");
      sval_00 = lookup_sval(tval_00,pcVar3);
      if (sval_00 < L'\0') {
        p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SVAL;
      }
      else {
        uVar1 = parser_getuint(p,"min");
        if ((uVar1 < 100) && (uVar1 = parser_getuint(p,"max"), uVar1 < 100)) {
          poVar4 = lookup_kind(tval_00,sval_00);
          if (poVar4 == (object_kind *)0x0) {
            return PARSE_ERROR_UNRECOGNISED_SVAL;
          }
          puVar5 = (undefined8 *)mem_zalloc(0x20);
          puVar5[1] = poVar4;
          uVar1 = parser_getuint(p,"chance");
          *(uint *)((long)puVar5 + 0x14) = uVar1;
          uVar1 = parser_getuint(p,"min");
          *(uint *)(puVar5 + 3) = uVar1;
          uVar1 = parser_getuint(p,"max");
          *(uint *)((long)puVar5 + 0x1c) = uVar1;
          *puVar5 = *(undefined8 *)((long)pvVar2 + 0xa0);
          *(undefined8 **)((long)pvVar2 + 0xa0) = puVar5;
          return PARSE_ERROR_NONE;
        }
        p_local._4_4_ = PARSE_ERROR_INVALID_ITEM_NUMBER;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_drop(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_drop *d;
	struct object_kind *k;
	int tval, sval;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	sval = lookup_sval(tval, parser_getsym(p, "sval"));
	if (sval < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	if (parser_getuint(p, "min") > 99 || parser_getuint(p, "max") > 99)
		return PARSE_ERROR_INVALID_ITEM_NUMBER;

	k = lookup_kind(tval, sval);
	if (!k)
		return PARSE_ERROR_UNRECOGNISED_SVAL;
		
	d = mem_zalloc(sizeof *d);
	d->kind = k;
	d->percent_chance = parser_getuint(p, "chance");
	d->min = parser_getuint(p, "min");
	d->max = parser_getuint(p, "max");
	d->next = r->drops;
	r->drops = d;
	return PARSE_ERROR_NONE;
}